

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataFlowOpts.cpp
# Opt level: O2

void __thiscall wasm::DataFlowOpts::optimizeExprToConstant(DataFlowOpts *this,Node *node)

{
  Expression *expr;
  pointer ppNVar1;
  Node *pNVar2;
  Expression **ppEVar3;
  Const *pCVar4;
  Expression *pEVar5;
  char *__assertion;
  uint uVar6;
  ulong uVar7;
  Name name;
  undefined1 local_5b8 [8];
  Module temp;
  PassRunner runner;
  Literal local_b0;
  string local_98;
  Literal local_78;
  Name local_60;
  HeapType local_50;
  Builder local_48;
  _Head_base<0UL,_wasm::Function_*,_false> local_40;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> tempFunc;
  
  tempFunc._M_t.super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
  super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
  super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl =
       (__uniq_ptr_data<wasm::Function,_std::default_delete<wasm::Function>,_true,_true>)
       (__uniq_ptr_data<wasm::Function,_std::default_delete<wasm::Function>,_true,_true>)this;
  if (node->type == Expr) {
    expr = (node->field_1).expr;
    if (expr->_id != ConstId) {
      uVar6 = 0;
      while( true ) {
        uVar7 = (ulong)uVar6;
        ppNVar1 = (node->values).
                  super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        if ((ulong)((long)(node->values).
                          super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)ppNVar1 >> 3) <= uVar7)
        break;
        pNVar2 = ppNVar1[uVar7];
        if ((pNVar2->type == Expr) && (((pNVar2->field_1).expr)->_id == ConstId)) {
          ppEVar3 = getIndexPointer((DataFlowOpts *)
                                    tempFunc._M_t.
                                    super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                                    .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl,
                                    expr,uVar6);
          pEVar5 = ((node->values).
                    super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>
                    ._M_impl.super__Vector_impl_data._M_start[uVar7]->field_1).expr;
          if (pEVar5->_id != ConstId) {
            pEVar5 = (Expression *)0x0;
          }
          local_5b8 = *(undefined1 (*) [8])
                       ((long)tempFunc._M_t.
                              super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                              .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl + 0x128);
          Literal::Literal(&local_b0,(Literal *)(pEVar5 + 1));
          pCVar4 = Builder::makeConst((Builder *)local_5b8,&local_b0);
          *ppEVar3 = (Expression *)pCVar4;
          Literal::~Literal(&local_b0);
        }
        uVar6 = uVar6 + 1;
      }
      Module::Module((Module *)local_5b8);
      Name::Name(&local_60,"temp");
      HeapType::HeapType(&local_50,(Signature)ZEXT816(0));
      runner.wasm = (Module *)0x0;
      temp.tagsMap._M_h._M_single_bucket = (__node_base_ptr)0x0;
      runner._vptr_PassRunner = (_func_int **)0x0;
      name.super_IString.str._M_str = (char *)local_60.super_IString.str._M_len;
      name.super_IString.str._M_len = (size_t)&local_40;
      Builder::makeFunction
                (name,(HeapType)local_60.super_IString.str._M_str,
                 (vector<wasm::Type,_std::allocator<wasm::Type>_> *)local_50.id,
                 (Expression *)&temp.tagsMap._M_h._M_single_bucket);
      std::_Vector_base<wasm::Type,_std::allocator<wasm::Type>_>::~_Vector_base
                ((_Vector_base<wasm::Type,_std::allocator<wasm::Type>_> *)
                 &temp.tagsMap._M_h._M_single_bucket);
      PassRunner::PassRunner((PassRunner *)&temp.tagsMap._M_h._M_single_bucket,(Module *)local_5b8);
      runner.options.passesToSkip._M_h._M_single_bucket._0_1_ = 1;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_98,"precompute",(allocator<char> *)&local_48);
      PassRunner::add((PassRunner *)&temp.tagsMap._M_h._M_single_bucket,&local_98,
                      (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&runner.isNested);
      std::
      _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::_M_reset((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&runner.isNested);
      std::__cxx11::string::~string((string *)&local_98);
      PassRunner::runOnFunction
                ((PassRunner *)&temp.tagsMap._M_h._M_single_bucket,local_40._M_head_impl);
      if ((local_40._M_head_impl)->body->_id == ConstId) {
        local_48.wasm =
             *(Module **)
              ((long)tempFunc._M_t.
                     super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>.
                     _M_t.
                     super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
                     super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl + 0x128);
        pCVar4 = Expression::cast<wasm::Const>((local_40._M_head_impl)->body);
        Literal::Literal(&local_78,&pCVar4->value);
        pCVar4 = Builder::makeConst(&local_48,&local_78);
        (node->field_1).expr = (Expression *)pCVar4;
        Literal::~Literal(&local_78);
        if ((node->type != Expr) || (((node->field_1).expr)->_id != ConstId)) {
          __assert_fail("node->isConst()",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/DataFlowOpts.cpp"
                        ,0x9c,"void wasm::DataFlowOpts::optimizeExprToConstant(DataFlow::Node *)");
        }
        DataFlow::Users::stopUsingValues
                  ((Users *)((long)tempFunc._M_t.
                                   super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                                   .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl +
                            0x130),node);
        ppNVar1 = (node->values).
                  super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        if ((node->values).
            super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>.
            _M_impl.super__Vector_impl_data._M_finish != ppNVar1) {
          (node->values).
          super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>.
          _M_impl.super__Vector_impl_data._M_finish = ppNVar1;
        }
        replaceAllUsesWith((DataFlowOpts *)
                           tempFunc._M_t.
                           super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                           .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl,node,node);
      }
      PassRunner::~PassRunner((PassRunner *)&temp.tagsMap._M_h._M_single_bucket);
      std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::~unique_ptr
                ((unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *)&local_40);
      Module::~Module((Module *)local_5b8);
      return;
    }
    __assertion = "!node->isConst()";
    uVar6 = 0x76;
  }
  else {
    __assertion = "node->isExpr()";
    uVar6 = 0x75;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/DataFlowOpts.cpp"
                ,uVar6,"void wasm::DataFlowOpts::optimizeExprToConstant(DataFlow::Node *)");
}

Assistant:

void optimizeExprToConstant(DataFlow::Node* node) {
    assert(node->isExpr());
    assert(!node->isConst());
    // std::cout << "will optimize an Expr of all constant inputs. before" <<
    //              '\n';
    // dump(node, std::cout);
    auto* expr = node->expr;
    // First, note that some of the expression's children may be
    // local.gets that we inferred during SSA analysis as constant.
    // We can apply those now.
    for (Index i = 0; i < node->values.size(); i++) {
      if (node->values[i]->isConst()) {
        auto* currp = getIndexPointer(expr, i);
        // Directly represent it as a constant. (Note that it may already be
        // a constant, but for now to avoid corner cases just replace them
        // all here.)
        auto* c = node->values[i]->expr->dynCast<Const>();
        *currp = Builder(*getModule()).makeConst(c->value);
      }
    }
    // Now we know that all our DataFlow inputs are constant, and all
    // our Binaryen IR representations of them are constant too. RUn
    // precompute, which will transform the expression into a constanat.
    Module temp;
    // XXX we should copy expr here, in principle, and definitely will need to
    //     when we do arbitrarily regenerated expressions
    std::unique_ptr<Function> tempFunc(Builder(temp).makeFunction(
      "temp", Signature(Type::none, Type::none), {}, expr));
    PassRunner runner(&temp);
    runner.setIsNested(true);
    runner.add("precompute");
    runner.runOnFunction(tempFunc.get());
    // Get the optimized thing
    auto* result = tempFunc->body;
    // It may not be a constant, e.g. 0 / 0 does not optimize to 0
    if (!result->is<Const>()) {
      return;
    }
    // All good, copy it.
    node->expr = Builder(*getModule()).makeConst(result->cast<Const>()->value);
    assert(node->isConst());
    // We no longer have values, and so do not use anything.
    nodeUsers.stopUsingValues(node);
    node->values.clear();
    // Our contents changed, update our users.
    replaceAllUsesWith(node, node);
  }